

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall
CVmObjLookupTable::set_or_add_entry(CVmObjLookupTable *this,vm_val_t *key,vm_val_t *val)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_lookup_val *pvVar3;
  
  pvVar3 = find_entry(this,key,(uint *)0x0,(vm_lookup_val **)0x0);
  if (pvVar3 != (vm_lookup_val *)0x0) {
    uVar2 = *(undefined4 *)&val->field_0x4;
    aVar1 = val->val;
    (pvVar3->val).typ = val->typ;
    *(undefined4 *)&(pvVar3->val).field_0x4 = uVar2;
    (pvVar3->val).val = aVar1;
    return;
  }
  add_entry(this,key,val);
  return;
}

Assistant:

void CVmObjLookupTable::set_or_add_entry(VMG_ const vm_val_t *key,
                                         const vm_val_t *val)
{
    vm_lookup_val *entry;

    /* look for an existing entry with this key */
    entry = find_entry(vmg_ key, 0, 0);

    /* if we found an existing entry, modify it; otherwise, add a new one */
    if (entry != 0)
    {   
        /* set the new value for this entry */
        entry->val = *val;
    }
    else
    {
        /* add a new entry with the given key */
        add_entry(vmg_ key, val);
    }
}